

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynNamespaceElement * __thiscall ParseContext::PushNamespace(ParseContext *this,SynIdentifier *name)

{
  SmallArray<SynNamespaceElement_*,_32U> *this_00;
  SynNamespaceElement *parent;
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  SynNamespaceElement *this_01;
  
  parent = this->currentNamespace;
  this_00 = &this->namespaceList;
  uVar2 = (this->namespaceList).count;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      this_01 = this_00->data[uVar4];
      if (this_01->parent == parent) {
        bVar1 = InplaceStr::operator==(&this_01->name->name,&name->name);
        if (bVar1) goto LAB_00214979;
        uVar2 = (this->namespaceList).count;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  iVar3 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
  this_01 = (SynNamespaceElement *)CONCAT44(extraout_var,iVar3);
  SynNamespaceElement::SynNamespaceElement(this_01,parent,name);
  uVar2 = (this->namespaceList).count;
  if (uVar2 == (this->namespaceList).max) {
    SmallArray<SynNamespaceElement_*,_32U>::grow(this_00,uVar2);
  }
  if (this_00->data == (SynNamespaceElement **)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<SynNamespaceElement *, 32>::push_back(const T &) [T = SynNamespaceElement *, N = 32]"
                 );
  }
  uVar2 = (this->namespaceList).count;
  (this->namespaceList).count = uVar2 + 1;
  this_00->data[uVar2] = this_01;
LAB_00214979:
  this->currentNamespace = this_01;
  return this_01;
}

Assistant:

SynNamespaceElement* ParseContext::PushNamespace(SynIdentifier *name)
{
	SynNamespaceElement *current = currentNamespace;

	// Search for existing namespace in the same context
	for(unsigned i = 0; i < namespaceList.size(); i++)
	{
		SynNamespaceElement *ns = namespaceList[i];

		if(ns->parent == current && ns->name->name == name->name)
		{
			currentNamespace = ns;
			return ns;
		}
	}

	// Create new namespace
	SynNamespaceElement *ns = new (get<SynNamespaceElement>()) SynNamespaceElement(current, name);
	namespaceList.push_back(ns);

	currentNamespace = ns;
	return ns;
}